

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

BytesValue * __thiscall
google::protobuf::util::(anonymous_namespace)::
WrapValue<google::protobuf::BytesValue,std::__cxx11::string>
          (BytesValue *__return_storage_ptr__,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  uint32_t *puVar1;
  Arena *arena;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  BytesValue *wrapper;
  
  BytesValue::BytesValue(__return_storage_ptr__);
  puVar1 = internal::HasBits<1>::operator[](&(__return_storage_ptr__->field_0)._impl_._has_bits_,0);
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)__return_storage_ptr__);
  internal::ArenaStringPtr::SetBytes<>
            (&(__return_storage_ptr__->field_0)._impl_.value_,(string *)this,arena);
  return __return_storage_ptr__;
}

Assistant:

static WrapperT WrapValue(T value) {
  WrapperT wrapper;
  wrapper.set_value(value);
  return wrapper;
}